

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeConstraint.cpp
# Opt level: O2

void __thiscall UnitTest::TimeConstraint::~TimeConstraint(TimeConstraint *this)

{
  TestResults *this_00;
  TestDetails *test;
  ostream *poVar1;
  TestResults **ppTVar2;
  char *failure;
  double dVar3;
  MemoryOutStream stream;
  MemoryOutStream local_1a8;
  
  dVar3 = Timer::GetTimeInMs(&this->m_timer);
  if ((double)this->m_maxMs < dVar3) {
    MemoryOutStream::MemoryOutStream(&local_1a8);
    poVar1 = std::operator<<((ostream *)&local_1a8,
                             "Time constraint failed. Expected to run test under ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_maxMs);
    std::operator<<(poVar1,"ms but took ");
    poVar1 = std::ostream::_M_insert<double>(dVar3);
    std::operator<<(poVar1,"ms.");
    ppTVar2 = CurrentTest::Results();
    this_00 = *ppTVar2;
    test = this->m_details;
    failure = MemoryOutStream::GetText(&local_1a8);
    TestResults::OnTestFailure(this_00,test,failure);
    MemoryOutStream::~MemoryOutStream(&local_1a8);
  }
  return;
}

Assistant:

TimeConstraint::~TimeConstraint()
{
    double const totalTimeInMs = m_timer.GetTimeInMs();
    if (totalTimeInMs > m_maxMs)
    {
        MemoryOutStream stream;
        stream << "Time constraint failed. Expected to run test under " << m_maxMs <<
                  "ms but took " << totalTimeInMs << "ms.";

		UnitTest::CurrentTest::Results()->OnTestFailure(m_details, stream.GetText());
    }
}